

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::log_internal::LogMessage::
CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
          (LogMessage *this,char ch,size_t num)

{
  Span<char> *pSVar1;
  size_t sVar2;
  Span<char> *pSVar3;
  Span<char> *in_RCX;
  Span<char> msg;
  Span<char> SVar4;
  Span<char> SVar5;
  Span<char> encoded_remaining_copy;
  
  pSVar1 = LogMessageData::encoded_remaining
                     ((this->data_)._M_t.
                      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                      .
                      super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                      ._M_head_impl);
  encoded_remaining_copy.ptr_ = pSVar1->ptr_;
  encoded_remaining_copy.len_ = pSVar1->len_;
  sVar2 = BufferSizeFor(6,kLengthDelimited);
  SVar4 = EncodeMessageStart(7,sVar2 + num,&encoded_remaining_copy);
  SVar5 = EncodeMessageStart(6,num,&encoded_remaining_copy);
  if ((log_internal *)SVar5.ptr_ == (log_internal *)0x0) {
    pSVar1 = LogMessageData::encoded_remaining
                       ((this->data_)._M_t.
                        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        .
                        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                        ._M_head_impl);
    pSVar3 = LogMessageData::encoded_remaining
                       ((this->data_)._M_t.
                        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        .
                        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                        ._M_head_impl);
    Span<char>::remove_suffix(pSVar1,pSVar3->len_);
  }
  else {
    AppendTruncated(ch,num,&encoded_remaining_copy);
    msg.len_ = (size_type)&encoded_remaining_copy;
    msg.ptr_ = (pointer)SVar5.len_;
    EncodeMessageLength((log_internal *)SVar5.ptr_,msg,in_RCX);
    SVar5.len_ = (size_type)&encoded_remaining_copy;
    SVar5.ptr_ = (pointer)SVar4.len_;
    EncodeMessageLength((log_internal *)SVar4.ptr_,SVar5,in_RCX);
    pSVar1 = LogMessageData::encoded_remaining
                       ((this->data_)._M_t.
                        super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                        .
                        super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                        ._M_head_impl);
    pSVar1->ptr_ = encoded_remaining_copy.ptr_;
    pSVar1->len_ = encoded_remaining_copy.len_;
  }
  return;
}

Assistant:

void LogMessage::CopyToEncodedBuffer(char ch, size_t num) {
  auto encoded_remaining_copy = data_->encoded_remaining();
  constexpr uint8_t tag_value = str_type == StringType::kLiteral
                                    ? ValueTag::kStringLiteral
                                    : ValueTag::kString;
  auto value_start = EncodeMessageStart(
      EventTag::kValue,
      BufferSizeFor(tag_value, WireType::kLengthDelimited) + num,
      &encoded_remaining_copy);
  auto str_start = EncodeMessageStart(tag_value, num, &encoded_remaining_copy);
  if (str_start.data()) {
    // The field headers fit.
    log_internal::AppendTruncated(ch, num, encoded_remaining_copy);
    EncodeMessageLength(str_start, &encoded_remaining_copy);
    EncodeMessageLength(value_start, &encoded_remaining_copy);
    data_->encoded_remaining() = encoded_remaining_copy;
  } else {
    // The field header(s) did not fit; zero `encoded_remaining()` so we don't
    // write anything else later.
    data_->encoded_remaining().remove_suffix(data_->encoded_remaining().size());
  }
}